

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O1

Result __thiscall
wabt::BinaryReaderLogging::OnFuncType
          (BinaryReaderLogging *this,Index index,Index param_count,Type *param_types,
          Index result_count,Type *result_types)

{
  Enum EVar1;
  
  WriteIndent(this);
  Stream::Writef(this->stream_,"OnType(index: %u, params: ",(ulong)index);
  LogTypes(this,param_count,param_types);
  Stream::Writef(this->stream_,", results: ");
  LogTypes(this,result_count,result_types);
  Stream::Writef(this->stream_,")\n");
  EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0xb])
                    (this->reader_,(ulong)index,(ulong)param_count,param_types,result_count,
                     result_types);
  return (Result)EVar1;
}

Assistant:

Result BinaryReaderLogging::OnFuncType(Index index,
                                       Index param_count,
                                       Type* param_types,
                                       Index result_count,
                                       Type* result_types) {
  // TODO: switch to "OnFuncType"?
  LOGF("OnType(index: %" PRIindex ", params: ", index);
  LogTypes(param_count, param_types);
  LOGF_NOINDENT(", results: ");
  LogTypes(result_count, result_types);
  LOGF_NOINDENT(")\n");
  return reader_->OnFuncType(index, param_count, param_types, result_count,
                             result_types);
}